

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitArrayOrFunctionDeclarator
          (DeclarationBinder *this,ArrayOrFunctionDeclaratorSyntax *node)

{
  _Elt_pointer ppTVar1;
  Action AVar2;
  TypeKind TVar3;
  SyntaxKind SVar4;
  Type *pTVar5;
  ostream *poVar6;
  SyntaxToken *__return_storage_ptr__;
  int iVar7;
  FunctionType *funcTy;
  SyntaxToken local_98;
  SyntaxToken local_60;
  
  AVar2 = SyntaxVisitor::
          visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                    (&this->super_SyntaxVisitor,
                     &node->attrs1_->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    );
  if (AVar2 == Quit) {
    return Quit;
  }
  SVar4 = C::SyntaxNode::kind(&node->suffix_->super_SyntaxNode);
  if (SVar4 == ParameterSuffix) {
    ppTVar1 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar1 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (ppTVar1 ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pTVar5 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
      }
      else {
        pTVar5 = ppTVar1[-1];
      }
      if (pTVar5 != (Type *)0x0) {
        TVar3 = Type::kind(pTVar5);
        if (TVar3 == Array) {
          __return_storage_ptr__ = &local_98;
          C::SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningArray(&this->diagReporter_,__return_storage_ptr__);
        }
        else {
          if (TVar3 == Error) {
            poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
            poVar6 = std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,":");
            iVar7 = 0x114;
            goto LAB_00302f82;
          }
          if (TVar3 != Function) goto LAB_00303026;
          __return_storage_ptr__ = &local_60;
          C::SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningFunction
                    (&this->diagReporter_,__return_storage_ptr__);
        }
        SyntaxToken::~SyntaxToken(__return_storage_ptr__);
LAB_00303026:
        funcTy = makeType<psy::C::FunctionType,psy::C::Type*>(this,pTVar5);
        pushType(this,&funcTy->super_Type);
        std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>::push_back
                  (&(this->pendingFuncTys_).c,&funcTy);
        AVar2 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar2 == Quit) {
          return Quit;
        }
        AVar2 = SyntaxVisitor::
                visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                          (&this->super_SyntaxVisitor,
                           &node->attrs2_->
                            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                          );
        if (AVar2 == Quit) {
          return Quit;
        }
        AVar2 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
        if (AVar2 == Quit) {
          return Quit;
        }
        pushNewScope(this,(SyntaxNode *)node,FunctionPrototype,true);
        AVar2 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->suffix_->super_SyntaxNode);
        if (AVar2 == Quit) {
          return Quit;
        }
        popAndStashScope(this);
        std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>::pop_back
                  (&(this->pendingFuncTys_).c);
        return Skip;
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar7 = 0xff;
  }
  else if (SVar4 == SubscriptSuffix) {
    ppTVar1 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar1 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (ppTVar1 ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pTVar5 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
      }
      else {
        pTVar5 = ppTVar1[-1];
      }
      if (pTVar5 != (Type *)0x0) {
        pTVar5 = &makeType<psy::C::ArrayType,psy::C::Type*>(this,pTVar5)->super_Type;
        pushType(this,pTVar5);
        AVar2 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar2 == Quit) {
          return Quit;
        }
        AVar2 = SyntaxVisitor::
                visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                          (&this->super_SyntaxVisitor,
                           &node->attrs2_->
                            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                          );
        if (AVar2 == Quit) {
          return Quit;
        }
        AVar2 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
        return (AVar2 == Quit) + Skip;
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar7 = 0xf6;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar7 = 0x127;
  }
LAB_00302f82:
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar7);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"<empty message>");
  std::endl<char,std::char_traits<char>>(poVar6);
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitArrayOrFunctionDeclarator(const ArrayOrFunctionDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    switch (node->suffix()->kind()) {
        case SyntaxKind::SubscriptSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            pushType(makeType<ArrayType>(ty));
            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            return Action::Skip;
        }

        case SyntaxKind::ParameterSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            switch (ty->kind()) {
                case TypeKind::Function:
                    diagReporter_.FunctionReturningFunction(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Array:
                    diagReporter_.FunctionReturningArray(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Pointer:
                case TypeKind::Basic:
                case TypeKind::Void:
                case TypeKind::Qualified:
                case TypeKind::Tag:
                case TypeKind::TypedefName:
                    break;

                case TypeKind::Error:
                    PSY_ASSERT_1(false);
                    return Action::Quit;
            }
            auto funcTy = makeType<FunctionType>(ty);
            pushType(funcTy);
            pendingFuncTys_.push(funcTy);

            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            pushNewScope(node, ScopeKind::FunctionPrototype, true);
            VISIT(node->suffix());
            popAndStashScope();

            pendingFuncTys_.pop();
            return Action::Skip;
        }

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
}